

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsDrawTest.cpp
# Opt level: O3

bool __thiscall deqp::gls::DrawTest::compare(DrawTest *this,Primitive primitiveType)

{
  int iVar1;
  ostringstream *poVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  uint uVar5;
  int iVar6;
  int iVar7;
  RGBA RVar8;
  RGBA RVar9;
  int iVar10;
  AttributePack *pAVar11;
  AttributePack *pAVar12;
  Surface *target;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  int iVar16;
  int iVar17;
  int iVar18;
  int iVar19;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  long lVar20;
  TestLog *pTVar21;
  int iVar22;
  int iVar23;
  Surface *pSVar24;
  ConstPixelBufferAccess *pCVar25;
  void *__buf;
  void *__buf_00;
  void *__buf_01;
  void *__buf_02;
  void *__buf_03;
  void *__buf_04;
  void *__buf_05;
  void *__buf_06;
  int iVar26;
  int iVar27;
  uint x;
  int iVar28;
  ChannelOrder CVar29;
  void *pvVar30;
  uint x_00;
  int local_5e0;
  int iStack_58c;
  ulong local_588;
  IVec3 renderTargetThreshold;
  IVec3 local_564;
  IVec4 local_558;
  Surface *local_540;
  string local_538;
  string local_518;
  string local_4f8;
  string local_4d8;
  PixelBufferAccess errorAccess;
  LogImageSet local_490;
  undefined1 local_450 [40];
  IVec4 local_428;
  TestLog *local_410;
  string local_408;
  string local_3e8;
  string local_3c8;
  string local_3a8;
  RGBA refPixel;
  ChannelType CStack_384;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_378;
  _Alloc_hider local_368;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_358 [6];
  RGBA screenPixel;
  ChannelType CStack_2f4;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2e8;
  _Alloc_hider local_2d8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2c8 [6];
  Vector<int,_4> res;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_258;
  _Alloc_hider local_248;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_238 [4];
  ios_base local_1f0 [264];
  LogImage local_e8;
  TextureLevel errorMask;
  
  pAVar11 = this->m_rrArrayPack;
  pAVar12 = this->m_glArrayPack;
  iVar16 = (*this->m_renderCtx->_vptr_RenderContext[4])();
  if (*(int *)(CONCAT44(extraout_var,iVar16) + 0x20) < 2) {
    if (primitiveType < PRIMITIVE_LAST) {
      local_540 = &pAVar11->m_screen;
      pSVar24 = &pAVar12->m_screen;
      if ((0x1f0U >> (primitiveType & 0x1f) & 1) == 0) {
        if ((0x60eU >> (primitiveType & 0x1f) & 1) == 0) {
          pTVar21 = ((this->super_TestCase).super_TestNode.m_testCtx)->m_log;
          refPixel.m_value = RGBA;
          CStack_384 = UNORM_INT8;
          pvVar30 = (void *)(pAVar11->m_screen).m_pixels.m_cap;
          if (pvVar30 != (void *)0x0) {
            pvVar30 = (pAVar11->m_screen).m_pixels.m_ptr;
          }
          tcu::ConstPixelBufferAccess::ConstPixelBufferAccess
                    ((ConstPixelBufferAccess *)&res,(TextureFormat *)&refPixel,
                     (pAVar11->m_screen).m_width,(pAVar11->m_screen).m_height,1,pvVar30);
          screenPixel.m_value = RGBA;
          CStack_2f4 = UNORM_INT8;
          pvVar30 = (void *)(pAVar12->m_screen).m_pixels.m_cap;
          if (pvVar30 != (void *)0x0) {
            pvVar30 = (pAVar12->m_screen).m_pixels.m_ptr;
          }
          tcu::ConstPixelBufferAccess::ConstPixelBufferAccess
                    ((ConstPixelBufferAccess *)&refPixel,(TextureFormat *)&screenPixel,
                     (pAVar12->m_screen).m_width,(pAVar12->m_screen).m_height,1,pvVar30);
          screenPixel.m_value = this->m_maxDiffRed;
          CStack_2f4 = this->m_maxDiffGreen;
          local_e8.m_name._M_dataplus._M_p = &DAT_100000001;
          local_e8.m_name._M_string_length = (ulong)local_e8.m_name._M_string_length._4_4_ << 0x20;
          bVar13 = tcu::intThresholdPositionDeviationErrorThresholdCompare
                             (pTVar21,"CompareResult","Result of rendering",
                              (ConstPixelBufferAccess *)&res,(ConstPixelBufferAccess *)&refPixel,
                              (UVec4 *)&screenPixel,(IVec3 *)&local_e8,true,0,COMPARE_LOG_RESULT);
          return bVar13;
        }
        iVar16 = (*this->m_renderCtx->_vptr_RenderContext[4])();
        lVar20 = CONCAT44(extraout_var_00,iVar16);
        CVar29 = R;
        if (0 < *(int *)(lVar20 + 0x14)) {
          CVar29 = 0x1000000 << (8U - (char)*(int *)(lVar20 + 0x14) & 0x1f);
        }
        screenPixel.m_value =
             0x100 << (8U - *(char *)(lVar20 + 0xc) & 0x1f) |
             1 << ((byte)(8 - *(char *)(lVar20 + 8)) & 0x1f) |
             0x10000 << (8U - *(char *)(lVar20 + 0x10) & 0x1f) | CVar29;
        tcu::RGBA::toIVec(&refPixel);
        res.m_data._0_8_ = &refPixel;
        res.m_data[2] = 0;
        res.m_data[3] = 1;
        local_258._M_allocated_capacity._0_4_ = 2;
        renderTargetThreshold.m_data[0] = 0;
        renderTargetThreshold.m_data[1] = 0;
        renderTargetThreshold.m_data[2] = 0;
        lVar20 = 2;
        do {
          (&renderTargetThreshold)[-1].m_data[lVar20 + 1] = (&refPixel)[res.m_data[lVar20]].m_value;
          lVar20 = lVar20 + 1;
        } while (lVar20 != 5);
        local_410 = ((this->super_TestCase).super_TestNode.m_testCtx)->m_log;
        uVar5 = this->m_maxDiffRed;
        iVar6 = this->m_maxDiffGreen;
        iVar7 = this->m_maxDiffBlue;
        local_558.m_data[0] = 0;
        local_558.m_data[1] = 0xff;
        local_558.m_data[2] = 0;
        local_558.m_data[3] = 0xff;
        local_428.m_data[0] = 0xff;
        local_428.m_data[1] = 0;
        local_428.m_data[2] = 0;
        local_428.m_data[3] = 0xff;
        iVar27 = (pAVar11->m_screen).m_width;
        iVar18 = (pAVar11->m_screen).m_height;
        res.m_data[0] = 7;
        res.m_data[1] = 3;
        local_564.m_data[0] = uVar5;
        local_564.m_data[1] = iVar6;
        local_564.m_data[2] = iVar7;
        tcu::TextureLevel::TextureLevel(&errorMask,(TextureFormat *)&res,iVar27,iVar18,1);
        tcu::TextureLevel::getAccess(&errorAccess,&errorMask);
        tcu::getSubregion((PixelBufferAccess *)&res,&errorAccess,0,0,iVar27,1);
        tcu::clear((PixelBufferAccess *)&res,&local_558);
        iVar16 = iVar18 + -1;
        tcu::getSubregion((PixelBufferAccess *)&res,&errorAccess,0,iVar16,iVar27,1);
        tcu::clear((PixelBufferAccess *)&res,&local_558);
        tcu::getSubregion((PixelBufferAccess *)&res,&errorAccess,0,0,1,iVar18);
        tcu::clear((PixelBufferAccess *)&res,&local_558);
        iVar27 = iVar27 + -1;
        tcu::getSubregion((PixelBufferAccess *)&res,&errorAccess,iVar27,0,1,iVar18);
        tcu::clear((PixelBufferAccess *)&res,&local_558);
        iVar18 = 0;
        if (1 < iVar16) {
          iVar18 = 0;
          iVar19 = 1;
          do {
            if (1 < iVar27) {
              iVar17 = iVar19 + -1;
              iVar23 = 1;
LAB_0186c2ff:
              RVar8.m_value =
                   *(deUint32 *)
                    ((long)(pAVar11->m_screen).m_pixels.m_ptr +
                    (long)((pAVar11->m_screen).m_width * iVar19 + iVar23) * 4);
              refPixel.m_value = RVar8.m_value;
              RVar9.m_value =
                   *(deUint32 *)
                    ((long)(pAVar12->m_screen).m_pixels.m_ptr +
                    (long)((pAVar12->m_screen).m_width * iVar19 + iVar23) * 4);
              screenPixel.m_value = RVar9.m_value;
              bVar13 = tcu::compareThresholdMasked
                                 (RVar8,RVar9,(RGBA)(iVar7 << 0x10 | iVar6 << 8 | uVar5),7);
              if (bVar13) {
LAB_0186c3b4:
                if ((RVar9.m_value & 0xffffff) == 0) {
                  res.m_data[0] = 0;
                }
                else {
                  res.m_data[0] =
                       ((RVar9.m_value >> 8 & 0xff) +
                        (RVar9.m_value >> 0x10 & 0xff) + (RVar9.m_value & 0xff) >> 3) + 0x32;
                }
                res.m_data[1] = 0xff;
                res.m_data[3] = 0xff;
                res.m_data[2] = res.m_data[0];
                tcu::PixelBufferAccess::setPixel(&errorAccess,&res,iVar23,iVar19,0);
              }
              else {
                bVar13 = pixelNeighborhoodContainsColor(pSVar24,iVar23,iVar19,&refPixel,&local_564);
                bVar14 = pixelNeighborhoodContainsColor
                                   (local_540,iVar23,iVar19,&screenPixel,&local_564);
                if (bVar13 && bVar14) goto LAB_0186c3b4;
                iVar10 = (pAVar11->m_screen).m_width;
                pvVar30 = (pAVar11->m_screen).m_pixels.m_ptr;
                iVar26 = iVar23 + iVar17 * iVar10;
                lVar20 = 3;
                do {
                  bVar13 = isEdgeTriplet((RGBA *)(ulong)*(uint *)((long)pvVar30 +
                                                                 (long)(iVar26 + -1) * 4),
                                         (RGBA *)(ulong)*(uint *)((long)pvVar30 + (long)iVar26 * 4),
                                         (RGBA *)(ulong)*(uint *)((long)pvVar30 +
                                                                 (long)(iVar26 + 1) * 4),
                                         &renderTargetThreshold);
                  if (bVar13) goto LAB_0186c553;
                  iVar26 = iVar26 + iVar10;
                  lVar20 = lVar20 + -1;
                } while (lVar20 != 0);
                local_588 = (ulong)((iVar10 * (iVar19 + 1) + iVar23) - 1);
                lVar20 = 0;
                do {
                  iVar26 = (int)lVar20;
                  bVar13 = isEdgeTriplet((RGBA *)(ulong)*(uint *)((long)pvVar30 +
                                                                 (long)(iVar23 + iVar10 * iVar17 +
                                                                        -1 + iVar26) * 4),
                                         (RGBA *)(ulong)*(uint *)((long)pvVar30 +
                                                                 (long)(iVar26 + iVar23 + iVar10 * 
                                                  iVar19 + -1) * 4),
                                         (RGBA *)(ulong)*(uint *)((long)pvVar30 +
                                                                 (long)((int)local_588 + iVar26) * 4
                                                                 ),&renderTargetThreshold);
                  if (bVar13) goto LAB_0186c553;
                  lVar20 = lVar20 + 1;
                } while (lVar20 != 3);
                tcu::PixelBufferAccess::setPixel(&errorAccess,&local_428,iVar23,iVar19,0);
                iVar18 = iVar18 + 1;
              }
              goto LAB_0186c6d7;
            }
LAB_0186c6f0:
            iVar19 = iVar19 + 1;
          } while (iVar19 != iVar16);
        }
        pTVar21 = local_410;
        poVar2 = (ostringstream *)(res.m_data + 2);
        res.m_data._0_8_ = local_410;
        std::__cxx11::ostringstream::ostringstream(poVar2);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar2,"Comparing images:\n",0x12);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar2,"\tallowed deviation in pixel positions = 1\n",0x2a);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar2,"\tnumber of allowed invalid pixels = ",0x24);
        std::ostream::operator<<(poVar2,10);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar2,"\n",1);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar2,"\tnumber of invalid pixels = ",0x1c);
        std::ostream::operator<<(poVar2,iVar18);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)&res,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream(poVar2);
        std::ios_base::~ios_base(local_1f0);
        bVar13 = iVar18 < 0xb;
        if (iVar18 < 0xb) {
          local_2e8._M_allocated_capacity._0_5_ = 0x61706d6f43;
          local_2e8._M_allocated_capacity._5_3_ = 0x526572;
          local_2e8._8_5_ = 0x746c757365;
          local_2e8._M_local_buf[0xd] = '\0';
          paVar3 = &local_e8.m_name.field_2;
          res.m_data[0] = 0x13;
          res.m_data[1] = 0;
          _screenPixel = (TextureFormat)&local_2e8;
          local_e8.m_name._M_dataplus._M_p = (pointer)paVar3;
          local_e8.m_name._M_dataplus._M_p =
               (pointer)std::__cxx11::string::_M_create((ulong *)&local_e8,(ulong)&res);
          local_e8.m_name.field_2._M_allocated_capacity._0_4_ = res.m_data[0];
          local_e8.m_name.field_2._M_allocated_capacity._4_4_ = res.m_data[1];
          builtin_strncpy(local_e8.m_name._M_dataplus._M_p,"Result of rendering",0x13);
          local_e8.m_name._M_string_length._0_4_ = res.m_data[0];
          local_e8.m_name._M_string_length._4_4_ = res.m_data[1];
          local_e8.m_name._M_dataplus._M_p[res.m_data._0_8_] = '\0';
          tcu::LogImageSet::LogImageSet
                    ((LogImageSet *)&refPixel,(string *)&screenPixel,&local_e8.m_name);
          tcu::TestLog::startImageSet(pTVar21,(char *)_refPixel,local_368._M_p);
          paVar4 = &local_490.m_name.field_2;
          local_490.m_name.field_2._M_allocated_capacity._0_4_ = 0x75736552;
          local_490.m_name.field_2._M_allocated_capacity._4_2_ = 0x746c;
          local_490.m_name._M_string_length = 6;
          local_490.m_name.field_2._M_local_buf[6] = '\0';
          local_450._16_4_ = 0x75736552;
          local_450._20_2_ = 0x746c;
          local_450._8_8_ = 6;
          local_450[0x16] = '\0';
          local_490.m_name._M_dataplus._M_p = (pointer)paVar4;
          local_450._0_8_ = (long)local_450 + 0x10;
          tcu::LogImage::LogImage
                    ((LogImage *)&res,&local_490.m_name,(string *)local_450,pSVar24,
                     QP_IMAGE_COMPRESSION_MODE_BEST);
          pTVar21 = local_410;
          tcu::LogImage::write((LogImage *)&res,(int)local_410,__buf,(size_t)pSVar24);
          tcu::TestLog::endImageSet(pTVar21);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_248._M_p != local_238) {
            operator_delete(local_248._M_p,local_238[0]._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)res.m_data._0_8_ != &local_258) {
            operator_delete((void *)res.m_data._0_8_,
                            CONCAT44(local_258._M_allocated_capacity._4_4_,
                                     local_258._M_allocated_capacity._0_4_) + 1);
          }
          if (local_450._0_8_ != (long)local_450 + 0x10) {
            operator_delete((void *)local_450._0_8_,
                            CONCAT17(local_450[0x17],
                                     CONCAT16(local_450[0x16],
                                              CONCAT24(local_450._20_2_,local_450._16_4_))) + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_490.m_name._M_dataplus._M_p != paVar4) {
            operator_delete(local_490.m_name._M_dataplus._M_p,
                            CONCAT17(local_490.m_name.field_2._M_local_buf[7],
                                     CONCAT16(local_490.m_name.field_2._M_local_buf[6],
                                              CONCAT24(local_490.m_name.field_2.
                                                       _M_allocated_capacity._4_2_,
                                                       local_490.m_name.field_2.
                                                       _M_allocated_capacity._0_4_))) + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_368._M_p != local_358) {
            operator_delete(local_368._M_p,local_358[0]._M_allocated_capacity + 1);
          }
          if (_refPixel != (TextureFormat)&local_378) {
            operator_delete((void *)_refPixel,local_378._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_e8.m_name._M_dataplus._M_p != paVar3) {
            operator_delete(local_e8.m_name._M_dataplus._M_p,
                            local_e8.m_name.field_2._M_allocated_capacity + 1);
          }
          if (_screenPixel != (TextureFormat)&local_2e8) {
            operator_delete((void *)_screenPixel,
                            CONCAT35(local_2e8._M_allocated_capacity._5_3_,
                                     local_2e8._M_allocated_capacity._0_5_) + 1);
          }
        }
        else {
          poVar2 = (ostringstream *)(res.m_data + 2);
          res.m_data._0_8_ = pTVar21;
          std::__cxx11::ostringstream::ostringstream(poVar2);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)poVar2,"Image comparison failed. Color threshold = (",0x2c);
          std::ostream::operator<<(poVar2,uVar5);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar2,", ",2);
          std::ostream::operator<<(poVar2,iVar6);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar2,", ",2);
          std::ostream::operator<<(poVar2,iVar7);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar2,")",1);
          pTVar21 = tcu::MessageBuilder::operator<<
                              ((MessageBuilder *)&res,(EndMessageToken *)&tcu::TestLog::EndMessage);
          local_4d8._M_dataplus._M_p = (pointer)&local_4d8.field_2;
          local_4d8.field_2._M_allocated_capacity._0_5_ = 0x61706d6f43;
          local_4d8.field_2._M_allocated_capacity._5_3_ = 0x526572;
          local_4d8.field_2._8_5_ = 0x746c757365;
          local_4d8._M_string_length = 0xd;
          local_4d8.field_2._M_local_buf[0xd] = '\0';
          local_538._M_dataplus._M_p = (pointer)&local_538.field_2;
          refPixel.m_value = S;
          CStack_384 = SNORM_INT8;
          local_538._M_dataplus._M_p =
               (pointer)std::__cxx11::string::_M_create((ulong *)&local_538,(ulong)&refPixel);
          local_538.field_2._M_allocated_capacity._0_4_ = refPixel.m_value;
          local_538.field_2._M_allocated_capacity._4_4_ = CStack_384;
          builtin_strncpy(local_538._M_dataplus._M_p,"Result of rendering",0x13);
          local_538._M_string_length._0_4_ = refPixel.m_value;
          local_538._M_string_length._4_4_ = CStack_384;
          local_538._M_dataplus._M_p[(long)_refPixel] = '\0';
          tcu::LogImageSet::LogImageSet(&local_490,&local_4d8,&local_538);
          tcu::TestLog::startImageSet
                    (pTVar21,local_490.m_name._M_dataplus._M_p,
                     local_490.m_description._M_dataplus._M_p);
          local_4f8._M_dataplus._M_p = (pointer)&local_4f8.field_2;
          local_4f8.field_2._M_allocated_capacity._0_4_ = 0x75736552;
          local_4f8.field_2._M_allocated_capacity._4_2_ = 0x746c;
          local_4f8._M_string_length = 6;
          local_4f8.field_2._M_local_buf[6] = '\0';
          local_518._M_dataplus._M_p = (pointer)&local_518.field_2;
          local_518.field_2._M_allocated_capacity._0_4_ = 0x75736552;
          local_518.field_2._M_allocated_capacity._4_2_ = 0x746c;
          local_518._M_string_length = 6;
          local_518.field_2._M_local_buf[6] = '\0';
          tcu::LogImage::LogImage
                    ((LogImage *)&refPixel,&local_4f8,&local_518,pSVar24,
                     QP_IMAGE_COMPRESSION_MODE_BEST);
          iVar16 = (int)pTVar21;
          tcu::LogImage::write((LogImage *)&refPixel,iVar16,__buf_01,(size_t)pSVar24);
          local_3a8.field_2._M_allocated_capacity = 0x636e657265666552;
          local_3a8.field_2._8_2_ = 0x65;
          local_3a8._M_string_length = 9;
          local_3c8.field_2._M_allocated_capacity = 0x636e657265666552;
          local_3c8.field_2._8_2_ = 0x65;
          local_3c8._M_string_length = 9;
          pSVar24 = local_540;
          local_3c8._M_dataplus._M_p = (pointer)&local_3c8.field_2;
          local_3a8._M_dataplus._M_p = (pointer)&local_3a8.field_2;
          tcu::LogImage::LogImage
                    ((LogImage *)&screenPixel,&local_3a8,&local_3c8,local_540,
                     QP_IMAGE_COMPRESSION_MODE_BEST);
          tcu::LogImage::write((LogImage *)&screenPixel,iVar16,__buf_02,(size_t)pSVar24);
          local_3e8.field_2._M_allocated_capacity = 0x73614d726f727245;
          local_3e8.field_2._8_2_ = 0x6b;
          local_3e8._M_string_length = 9;
          local_408.field_2._M_allocated_capacity = 0x616d20726f727245;
          local_408.field_2._8_2_ = 0x6b73;
          local_408._M_string_length = 10;
          local_408.field_2._M_local_buf[10] = '\0';
          local_408._M_dataplus._M_p = (pointer)&local_408.field_2;
          local_3e8._M_dataplus._M_p = (pointer)&local_3e8.field_2;
          tcu::ConstPixelBufferAccess::ConstPixelBufferAccess
                    ((ConstPixelBufferAccess *)local_450,&errorMask);
          pCVar25 = (ConstPixelBufferAccess *)local_450;
          tcu::LogImage::LogImage
                    (&local_e8,&local_3e8,&local_408,pCVar25,QP_IMAGE_COMPRESSION_MODE_BEST);
          tcu::LogImage::write(&local_e8,iVar16,__buf_03,(size_t)pCVar25);
          tcu::TestLog::endImageSet(pTVar21);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_e8.m_description._M_dataplus._M_p != &local_e8.m_description.field_2) {
            operator_delete(local_e8.m_description._M_dataplus._M_p,
                            local_e8.m_description.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_e8.m_name._M_dataplus._M_p != &local_e8.m_name.field_2) {
            operator_delete(local_e8.m_name._M_dataplus._M_p,
                            local_e8.m_name.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_408._M_dataplus._M_p != &local_408.field_2) {
            operator_delete(local_408._M_dataplus._M_p,local_408.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_3e8._M_dataplus._M_p != &local_3e8.field_2) {
            operator_delete(local_3e8._M_dataplus._M_p,local_3e8.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2d8._M_p != local_2c8) {
            operator_delete(local_2d8._M_p,local_2c8[0]._M_allocated_capacity + 1);
          }
          if (_screenPixel != (TextureFormat)&local_2e8) {
            operator_delete((void *)_screenPixel,
                            CONCAT35(local_2e8._M_allocated_capacity._5_3_,
                                     local_2e8._M_allocated_capacity._0_5_) + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_3c8._M_dataplus._M_p != &local_3c8.field_2) {
            operator_delete(local_3c8._M_dataplus._M_p,local_3c8.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_3a8._M_dataplus._M_p != &local_3a8.field_2) {
            operator_delete(local_3a8._M_dataplus._M_p,local_3a8.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_368._M_p != local_358) {
            operator_delete(local_368._M_p,local_358[0]._M_allocated_capacity + 1);
          }
          if (_refPixel != (TextureFormat)&local_378) {
            operator_delete((void *)_refPixel,local_378._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_518._M_dataplus._M_p != &local_518.field_2) {
            operator_delete(local_518._M_dataplus._M_p,
                            CONCAT17(local_518.field_2._M_local_buf[7],
                                     CONCAT16(local_518.field_2._M_local_buf[6],
                                              CONCAT24(local_518.field_2._M_allocated_capacity._4_2_
                                                       ,local_518.field_2._M_allocated_capacity.
                                                        _0_4_))) + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_4f8._M_dataplus._M_p != &local_4f8.field_2) {
            operator_delete(local_4f8._M_dataplus._M_p,
                            CONCAT17(local_4f8.field_2._M_local_buf[7],
                                     CONCAT16(local_4f8.field_2._M_local_buf[6],
                                              CONCAT24(local_4f8.field_2._M_allocated_capacity._4_2_
                                                       ,local_4f8.field_2._M_allocated_capacity.
                                                        _0_4_))) + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_490.m_description._M_dataplus._M_p != &local_490.m_description.field_2) {
            operator_delete(local_490.m_description._M_dataplus._M_p,
                            local_490.m_description.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_490.m_name._M_dataplus._M_p != &local_490.m_name.field_2) {
            operator_delete(local_490.m_name._M_dataplus._M_p,
                            CONCAT17(local_490.m_name.field_2._M_local_buf[7],
                                     CONCAT16(local_490.m_name.field_2._M_local_buf[6],
                                              CONCAT24(local_490.m_name.field_2.
                                                       _M_allocated_capacity._4_2_,
                                                       local_490.m_name.field_2.
                                                       _M_allocated_capacity._0_4_))) + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_538._M_dataplus._M_p != &local_538.field_2) {
            operator_delete(local_538._M_dataplus._M_p,local_538.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_4d8._M_dataplus._M_p != &local_4d8.field_2) {
            operator_delete(local_4d8._M_dataplus._M_p,
                            CONCAT35(local_4d8.field_2._M_allocated_capacity._5_3_,
                                     local_4d8.field_2._M_allocated_capacity._0_5_) + 1);
          }
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)(res.m_data + 2));
          std::ios_base::~ios_base(local_1f0);
        }
      }
      else {
        pTVar21 = ((this->super_TestCase).super_TestNode.m_testCtx)->m_log;
        uVar5 = this->m_maxDiffRed;
        iVar6 = this->m_maxDiffGreen;
        renderTargetThreshold.m_data[0] = this->m_maxDiffRed;
        renderTargetThreshold.m_data[1] = this->m_maxDiffGreen;
        iVar7 = this->m_maxDiffBlue;
        local_558.m_data[0] = 0;
        local_558.m_data[1] = 0xff;
        local_558.m_data[2] = 0;
        local_558.m_data[3] = 0xff;
        local_428.m_data[0] = 0xff;
        local_428.m_data[1] = 0;
        local_428.m_data[2] = 0;
        local_428.m_data[3] = 0xff;
        iVar27 = (pAVar11->m_screen).m_width;
        iVar18 = (pAVar11->m_screen).m_height;
        res.m_data[0] = 7;
        res.m_data[1] = 3;
        renderTargetThreshold.m_data[2] = iVar7;
        tcu::TextureLevel::TextureLevel(&errorMask,(TextureFormat *)&res,iVar27,iVar18,1);
        tcu::TextureLevel::getAccess(&errorAccess,&errorMask);
        tcu::getSubregion((PixelBufferAccess *)&res,&errorAccess,0,0,iVar27,1);
        tcu::clear((PixelBufferAccess *)&res,&local_558);
        iVar16 = iVar18 + -1;
        tcu::getSubregion((PixelBufferAccess *)&res,&errorAccess,0,iVar16,iVar27,1);
        tcu::clear((PixelBufferAccess *)&res,&local_558);
        tcu::getSubregion((PixelBufferAccess *)&res,&errorAccess,0,0,1,iVar18);
        tcu::clear((PixelBufferAccess *)&res,&local_558);
        x = iVar27 - 1;
        tcu::getSubregion((PixelBufferAccess *)&res,&errorAccess,x,0,1,iVar18);
        tcu::clear((PixelBufferAccess *)&res,&local_558);
        local_5e0 = 0;
        if (1 < iVar16) {
          iVar18 = 1;
          iVar27 = 0;
          local_5e0 = 0;
          do {
            if (1 < (int)x) {
              x_00 = 1;
              local_588 = local_588 & 0xffffffff00000000;
              do {
                RVar8.m_value =
                     *(deUint32 *)
                      ((long)(pAVar11->m_screen).m_pixels.m_ptr +
                      (long)(int)((pAVar11->m_screen).m_width * iVar18 + x_00) * 4);
                refPixel.m_value = RVar8.m_value;
                RVar9.m_value =
                     *(deUint32 *)
                      ((long)(pAVar12->m_screen).m_pixels.m_ptr +
                      (long)(int)((pAVar12->m_screen).m_width * iVar18 + x_00) * 4);
                screenPixel.m_value = RVar9.m_value;
                bVar13 = tcu::compareThresholdMasked
                                   (RVar8,RVar9,(RGBA)(iVar7 << 0x10 | iVar6 << 8 | uVar5),7);
                bVar14 = true;
                bVar15 = true;
                if (!bVar13) {
                  bVar14 = pixelNeighborhoodContainsColor
                                     (local_540,x_00,iVar18,&screenPixel,&renderTargetThreshold);
                  bVar15 = pixelNeighborhoodContainsColor
                                     (pSVar24,x_00,iVar18,&refPixel,&renderTargetThreshold);
                }
                if ((bVar14 == false) || (bVar15 == false)) {
                  iVar19 = (pAVar11->m_screen).m_width;
                  target = (Surface *)(pAVar11->m_screen).m_pixels.m_ptr;
                  bVar13 = pixelNearLineIntersection((gls *)(ulong)x_00,iVar18,iVar19,target);
                  if ((bVar13) ||
                     (bVar13 = pixelNearLineIntersection
                                         ((gls *)(ulong)x_00,iVar18,(pAVar12->m_screen).m_width,
                                          (Surface *)(pAVar12->m_screen).m_pixels.m_ptr), bVar13)) {
                    iVar23 = iVar27 * iVar19 + (int)local_588;
                    bVar13 = true;
                    iVar17 = -1;
                    do {
                      lVar20 = 0;
                      do {
                        if ((((&target->m_width)[iVar23 + (int)lVar20] & 0xffffffU) == 0) !=
                            ((RVar9.m_value & 0xffffff) != 0)) goto LAB_0186cd8d;
                        lVar20 = lVar20 + 1;
                      } while (lVar20 != 3);
                      iVar10 = iVar17 + 1;
                      bVar13 = iVar17 < 1;
                      iVar23 = iVar23 + iVar19;
                      iVar17 = iVar10;
                    } while (iVar10 != 2);
LAB_0186cd8d:
                    iVar19 = (pAVar12->m_screen).m_width;
                    iVar23 = iVar27 * iVar19 + (int)local_588;
                    bVar14 = true;
                    iVar17 = -1;
                    do {
                      lVar20 = 0;
                      do {
                        if (((*(uint *)((long)(pAVar12->m_screen).m_pixels.m_ptr +
                                       (long)(iVar23 + (int)lVar20) * 4) & 0xffffff) == 0) !=
                            ((RVar8.m_value & 0xffffff) != 0)) goto LAB_0186cdfc;
                        lVar20 = lVar20 + 1;
                      } while (lVar20 != 3);
                      iVar10 = iVar17 + 1;
                      bVar14 = iVar17 < 1;
                      iVar23 = iVar23 + iVar19;
                      iVar17 = iVar10;
                    } while (iVar10 != 2);
LAB_0186cdfc:
                    if ((bool)(bVar13 & bVar14)) {
                      if ((RVar9.m_value & 0xffffff) == 0) {
                        res.m_data[0] = 0;
                      }
                      else {
                        res.m_data[0] =
                             ((RVar9.m_value >> 8 & 0xff) +
                              (RVar9.m_value >> 0x10 & 0xff) + (RVar9.m_value & 0xff) >> 3) + 0x32;
                      }
                      res.m_data[1] = 0xff;
                      res.m_data[3] = 0xff;
                      res.m_data[2] = res.m_data[0];
                      tcu::PixelBufferAccess::setPixel(&errorAccess,&res,x_00,iVar18,0);
                    }
                    else {
                      tcu::PixelBufferAccess::setPixel(&errorAccess,&local_428,x_00,iVar18,0);
                      local_5e0 = local_5e0 + 1;
                    }
                  }
                  else {
                    tcu::PixelBufferAccess::setPixel(&errorAccess,&local_428,x_00,iVar18,0);
                    local_5e0 = local_5e0 + 1;
                  }
                }
                else {
                  if ((RVar9.m_value & 0xffffff) == 0) {
                    res.m_data[0] = 0;
                  }
                  else {
                    res.m_data[0] =
                         ((RVar9.m_value >> 8 & 0xff) +
                          (RVar9.m_value >> 0x10 & 0xff) + (RVar9.m_value & 0xff) >> 3) + 0x32;
                  }
                  res.m_data[1] = 0xff;
                  res.m_data[3] = 0xff;
                  res.m_data[2] = res.m_data[0];
                  tcu::PixelBufferAccess::setPixel(&errorAccess,&res,x_00,iVar18,0);
                }
                x_00 = x_00 + 1;
                local_588 = CONCAT44(local_588._4_4_,(int)local_588 + 1);
              } while (x_00 != x);
            }
            iVar18 = iVar18 + 1;
            iVar27 = iVar27 + 1;
          } while (iVar18 != iVar16);
        }
        poVar2 = (ostringstream *)(res.m_data + 2);
        res.m_data._0_8_ = pTVar21;
        std::__cxx11::ostringstream::ostringstream(poVar2);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar2,"Comparing images:\n",0x12);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar2,"\tallowed deviation in pixel positions = 1\n",0x2a);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar2,"\tnumber of allowed invalid pixels = ",0x24);
        std::ostream::operator<<(poVar2,5);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar2,"\n",1);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar2,"\tnumber of invalid pixels = ",0x1c);
        std::ostream::operator<<(poVar2,local_5e0);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)&res,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream(poVar2);
        std::ios_base::~ios_base(local_1f0);
        bVar13 = local_5e0 < 6;
        if (local_5e0 < 6) {
          local_2e8._M_allocated_capacity._0_5_ = 0x61706d6f43;
          local_2e8._M_allocated_capacity._5_3_ = 0x526572;
          local_2e8._8_5_ = 0x746c757365;
          local_2e8._M_local_buf[0xd] = '\0';
          paVar3 = &local_e8.m_name.field_2;
          res.m_data[0] = 0x13;
          res.m_data[1] = 0;
          _screenPixel = (TextureFormat)&local_2e8;
          local_e8.m_name._M_dataplus._M_p = (pointer)paVar3;
          local_e8.m_name._M_dataplus._M_p =
               (pointer)std::__cxx11::string::_M_create((ulong *)&local_e8,(ulong)&res);
          local_e8.m_name.field_2._M_allocated_capacity._0_4_ = res.m_data[0];
          local_e8.m_name.field_2._M_allocated_capacity._4_4_ = res.m_data[1];
          builtin_strncpy(local_e8.m_name._M_dataplus._M_p,"Result of rendering",0x13);
          local_e8.m_name._M_string_length._0_4_ = res.m_data[0];
          local_e8.m_name._M_string_length._4_4_ = res.m_data[1];
          local_e8.m_name._M_dataplus._M_p[res.m_data._0_8_] = '\0';
          tcu::LogImageSet::LogImageSet
                    ((LogImageSet *)&refPixel,(string *)&screenPixel,&local_e8.m_name);
          tcu::TestLog::startImageSet(pTVar21,(char *)_refPixel,local_368._M_p);
          paVar4 = &local_490.m_name.field_2;
          local_490.m_name.field_2._M_allocated_capacity._0_4_ = 0x75736552;
          local_490.m_name.field_2._M_allocated_capacity._4_2_ = 0x746c;
          local_490.m_name._M_string_length = 6;
          local_490.m_name.field_2._M_local_buf[6] = '\0';
          local_450._16_4_ = 0x75736552;
          local_450._20_2_ = 0x746c;
          local_450._8_8_ = 6;
          local_450[0x16] = '\0';
          local_490.m_name._M_dataplus._M_p = (pointer)paVar4;
          local_450._0_8_ = (long)local_450 + 0x10;
          tcu::LogImage::LogImage
                    ((LogImage *)&res,&local_490.m_name,(string *)local_450,pSVar24,
                     QP_IMAGE_COMPRESSION_MODE_BEST);
          tcu::LogImage::write((LogImage *)&res,(int)pTVar21,__buf_00,(size_t)pSVar24);
          tcu::TestLog::endImageSet(pTVar21);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_248._M_p != local_238) {
            operator_delete(local_248._M_p,local_238[0]._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)res.m_data._0_8_ != &local_258) {
            operator_delete((void *)res.m_data._0_8_,
                            CONCAT44(local_258._M_allocated_capacity._4_4_,
                                     local_258._M_allocated_capacity._0_4_) + 1);
          }
          if (local_450._0_8_ != (long)local_450 + 0x10) {
            operator_delete((void *)local_450._0_8_,
                            CONCAT17(local_450[0x17],
                                     CONCAT16(local_450[0x16],
                                              CONCAT24(local_450._20_2_,local_450._16_4_))) + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_490.m_name._M_dataplus._M_p != paVar4) {
            operator_delete(local_490.m_name._M_dataplus._M_p,
                            CONCAT17(local_490.m_name.field_2._M_local_buf[7],
                                     CONCAT16(local_490.m_name.field_2._M_local_buf[6],
                                              CONCAT24(local_490.m_name.field_2.
                                                       _M_allocated_capacity._4_2_,
                                                       local_490.m_name.field_2.
                                                       _M_allocated_capacity._0_4_))) + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_368._M_p != local_358) {
            operator_delete(local_368._M_p,local_358[0]._M_allocated_capacity + 1);
          }
          if (_refPixel != (TextureFormat)&local_378) {
            operator_delete((void *)_refPixel,local_378._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_e8.m_name._M_dataplus._M_p != paVar3) {
            operator_delete(local_e8.m_name._M_dataplus._M_p,
                            local_e8.m_name.field_2._M_allocated_capacity + 1);
          }
          if (_screenPixel != (TextureFormat)&local_2e8) {
            operator_delete((void *)_screenPixel,
                            CONCAT35(local_2e8._M_allocated_capacity._5_3_,
                                     local_2e8._M_allocated_capacity._0_5_) + 1);
          }
        }
        else {
          poVar2 = (ostringstream *)(res.m_data + 2);
          res.m_data._0_8_ = pTVar21;
          std::__cxx11::ostringstream::ostringstream(poVar2);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)poVar2,"Image comparison failed. Color threshold = (",0x2c);
          std::ostream::operator<<(poVar2,uVar5);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar2,", ",2);
          std::ostream::operator<<(poVar2,iVar6);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar2,", ",2);
          std::ostream::operator<<(poVar2,iVar7);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar2,")",1);
          pTVar21 = tcu::MessageBuilder::operator<<
                              ((MessageBuilder *)&res,(EndMessageToken *)&tcu::TestLog::EndMessage);
          local_4d8._M_dataplus._M_p = (pointer)&local_4d8.field_2;
          local_4d8.field_2._M_allocated_capacity._0_5_ = 0x61706d6f43;
          local_4d8.field_2._M_allocated_capacity._5_3_ = 0x526572;
          local_4d8.field_2._8_5_ = 0x746c757365;
          local_4d8._M_string_length = 0xd;
          local_4d8.field_2._M_local_buf[0xd] = '\0';
          local_538._M_dataplus._M_p = (pointer)&local_538.field_2;
          refPixel.m_value = S;
          CStack_384 = SNORM_INT8;
          local_538._M_dataplus._M_p =
               (pointer)std::__cxx11::string::_M_create((ulong *)&local_538,(ulong)&refPixel);
          local_538.field_2._M_allocated_capacity._0_4_ = refPixel.m_value;
          local_538.field_2._M_allocated_capacity._4_4_ = CStack_384;
          builtin_strncpy(local_538._M_dataplus._M_p,"Result of rendering",0x13);
          local_538._M_string_length._0_4_ = refPixel.m_value;
          local_538._M_string_length._4_4_ = CStack_384;
          local_538._M_dataplus._M_p[(long)_refPixel] = '\0';
          tcu::LogImageSet::LogImageSet(&local_490,&local_4d8,&local_538);
          tcu::TestLog::startImageSet
                    (pTVar21,local_490.m_name._M_dataplus._M_p,
                     local_490.m_description._M_dataplus._M_p);
          local_4f8._M_dataplus._M_p = (pointer)&local_4f8.field_2;
          local_4f8.field_2._M_allocated_capacity._0_4_ = 0x75736552;
          local_4f8.field_2._M_allocated_capacity._4_2_ = 0x746c;
          local_4f8._M_string_length = 6;
          local_4f8.field_2._M_local_buf[6] = '\0';
          local_518._M_dataplus._M_p = (pointer)&local_518.field_2;
          local_518.field_2._M_allocated_capacity._0_4_ = 0x75736552;
          local_518.field_2._M_allocated_capacity._4_2_ = 0x746c;
          local_518._M_string_length = 6;
          local_518.field_2._M_local_buf[6] = '\0';
          tcu::LogImage::LogImage
                    ((LogImage *)&refPixel,&local_4f8,&local_518,pSVar24,
                     QP_IMAGE_COMPRESSION_MODE_BEST);
          iVar16 = (int)pTVar21;
          tcu::LogImage::write((LogImage *)&refPixel,iVar16,__buf_04,(size_t)pSVar24);
          local_3a8.field_2._M_allocated_capacity = 0x636e657265666552;
          local_3a8.field_2._8_2_ = 0x65;
          local_3a8._M_string_length = 9;
          local_3c8.field_2._M_allocated_capacity = 0x636e657265666552;
          local_3c8.field_2._8_2_ = 0x65;
          local_3c8._M_string_length = 9;
          pSVar24 = local_540;
          local_3c8._M_dataplus._M_p = (pointer)&local_3c8.field_2;
          local_3a8._M_dataplus._M_p = (pointer)&local_3a8.field_2;
          tcu::LogImage::LogImage
                    ((LogImage *)&screenPixel,&local_3a8,&local_3c8,local_540,
                     QP_IMAGE_COMPRESSION_MODE_BEST);
          tcu::LogImage::write((LogImage *)&screenPixel,iVar16,__buf_05,(size_t)pSVar24);
          local_3e8.field_2._M_allocated_capacity = 0x73614d726f727245;
          local_3e8.field_2._8_2_ = 0x6b;
          local_3e8._M_string_length = 9;
          local_408.field_2._M_allocated_capacity = 0x616d20726f727245;
          local_408.field_2._8_2_ = 0x6b73;
          local_408._M_string_length = 10;
          local_408.field_2._M_local_buf[10] = '\0';
          local_408._M_dataplus._M_p = (pointer)&local_408.field_2;
          local_3e8._M_dataplus._M_p = (pointer)&local_3e8.field_2;
          tcu::ConstPixelBufferAccess::ConstPixelBufferAccess
                    ((ConstPixelBufferAccess *)local_450,&errorMask);
          pCVar25 = (ConstPixelBufferAccess *)local_450;
          tcu::LogImage::LogImage
                    (&local_e8,&local_3e8,&local_408,pCVar25,QP_IMAGE_COMPRESSION_MODE_BEST);
          tcu::LogImage::write(&local_e8,iVar16,__buf_06,(size_t)pCVar25);
          tcu::TestLog::endImageSet(pTVar21);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_e8.m_description._M_dataplus._M_p != &local_e8.m_description.field_2) {
            operator_delete(local_e8.m_description._M_dataplus._M_p,
                            local_e8.m_description.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_e8.m_name._M_dataplus._M_p != &local_e8.m_name.field_2) {
            operator_delete(local_e8.m_name._M_dataplus._M_p,
                            local_e8.m_name.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_408._M_dataplus._M_p != &local_408.field_2) {
            operator_delete(local_408._M_dataplus._M_p,local_408.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_3e8._M_dataplus._M_p != &local_3e8.field_2) {
            operator_delete(local_3e8._M_dataplus._M_p,local_3e8.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2d8._M_p != local_2c8) {
            operator_delete(local_2d8._M_p,local_2c8[0]._M_allocated_capacity + 1);
          }
          if (_screenPixel != (TextureFormat)&local_2e8) {
            operator_delete((void *)_screenPixel,
                            CONCAT35(local_2e8._M_allocated_capacity._5_3_,
                                     local_2e8._M_allocated_capacity._0_5_) + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_3c8._M_dataplus._M_p != &local_3c8.field_2) {
            operator_delete(local_3c8._M_dataplus._M_p,local_3c8.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_3a8._M_dataplus._M_p != &local_3a8.field_2) {
            operator_delete(local_3a8._M_dataplus._M_p,local_3a8.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_368._M_p != local_358) {
            operator_delete(local_368._M_p,local_358[0]._M_allocated_capacity + 1);
          }
          if (_refPixel != (TextureFormat)&local_378) {
            operator_delete((void *)_refPixel,local_378._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_518._M_dataplus._M_p != &local_518.field_2) {
            operator_delete(local_518._M_dataplus._M_p,
                            CONCAT17(local_518.field_2._M_local_buf[7],
                                     CONCAT16(local_518.field_2._M_local_buf[6],
                                              CONCAT24(local_518.field_2._M_allocated_capacity._4_2_
                                                       ,local_518.field_2._M_allocated_capacity.
                                                        _0_4_))) + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_4f8._M_dataplus._M_p != &local_4f8.field_2) {
            operator_delete(local_4f8._M_dataplus._M_p,
                            CONCAT17(local_4f8.field_2._M_local_buf[7],
                                     CONCAT16(local_4f8.field_2._M_local_buf[6],
                                              CONCAT24(local_4f8.field_2._M_allocated_capacity._4_2_
                                                       ,local_4f8.field_2._M_allocated_capacity.
                                                        _0_4_))) + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_490.m_description._M_dataplus._M_p != &local_490.m_description.field_2) {
            operator_delete(local_490.m_description._M_dataplus._M_p,
                            local_490.m_description.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_490.m_name._M_dataplus._M_p != &local_490.m_name.field_2) {
            operator_delete(local_490.m_name._M_dataplus._M_p,
                            CONCAT17(local_490.m_name.field_2._M_local_buf[7],
                                     CONCAT16(local_490.m_name.field_2._M_local_buf[6],
                                              CONCAT24(local_490.m_name.field_2.
                                                       _M_allocated_capacity._4_2_,
                                                       local_490.m_name.field_2.
                                                       _M_allocated_capacity._0_4_))) + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_538._M_dataplus._M_p != &local_538.field_2) {
            operator_delete(local_538._M_dataplus._M_p,local_538.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_4d8._M_dataplus._M_p != &local_4d8.field_2) {
            operator_delete(local_4d8._M_dataplus._M_p,
                            CONCAT35(local_4d8.field_2._M_allocated_capacity._5_3_,
                                     local_4d8.field_2._M_allocated_capacity._0_5_) + 1);
          }
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)(res.m_data + 2));
          std::ios_base::~ios_base(local_1f0);
        }
      }
      tcu::TextureLevel::~TextureLevel(&errorMask);
    }
    else {
      bVar13 = false;
    }
  }
  else {
    res.m_data._0_8_ = ((this->super_TestCase).super_TestNode.m_testCtx)->m_log;
    poVar2 = (ostringstream *)(res.m_data + 2);
    std::__cxx11::ostringstream::ostringstream(poVar2);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar2,
               "Warning: Comparision of result from multisample render targets are not as stricts as without multisampling. Might produce false positives!"
               ,0x8a);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)&res,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar2);
    std::ios_base::~ios_base(local_1f0);
    pTVar21 = ((this->super_TestCase).super_TestNode.m_testCtx)->m_log;
    refPixel.m_value = RGBA;
    CStack_384 = UNORM_INT8;
    pvVar30 = (void *)(pAVar11->m_screen).m_pixels.m_cap;
    if (pvVar30 != (void *)0x0) {
      pvVar30 = (pAVar11->m_screen).m_pixels.m_ptr;
    }
    tcu::ConstPixelBufferAccess::ConstPixelBufferAccess
              ((ConstPixelBufferAccess *)&res,(TextureFormat *)&refPixel,(pAVar11->m_screen).m_width
               ,(pAVar11->m_screen).m_height,1,pvVar30);
    screenPixel.m_value = RGBA;
    CStack_2f4 = UNORM_INT8;
    pvVar30 = (void *)(pAVar12->m_screen).m_pixels.m_cap;
    if (pvVar30 != (void *)0x0) {
      pvVar30 = (pAVar12->m_screen).m_pixels.m_ptr;
    }
    tcu::ConstPixelBufferAccess::ConstPixelBufferAccess
              ((ConstPixelBufferAccess *)&refPixel,(TextureFormat *)&screenPixel,
               (pAVar12->m_screen).m_width,(pAVar12->m_screen).m_height,1,pvVar30);
    bVar13 = tcu::fuzzyCompare(pTVar21,"Compare Results","Compare Results",
                               (ConstPixelBufferAccess *)&res,(ConstPixelBufferAccess *)&refPixel,
                               0.3,COMPARE_LOG_RESULT);
  }
  return bVar13;
LAB_0186c553:
  iVar26 = (pAVar12->m_screen).m_width;
  iVar28 = iVar23 + iVar17 * iVar26 + -1;
  bVar13 = true;
  iVar22 = -1;
  do {
    lVar20 = 0;
    do {
      if (((*(uint *)((long)(pAVar12->m_screen).m_pixels.m_ptr + (long)(iVar28 + (int)lVar20) * 4) &
           0xffffff) == 0) != ((RVar8.m_value & 0xffffff) != 0)) goto LAB_0186c5be;
      lVar20 = lVar20 + 1;
    } while (lVar20 != 3);
    iVar1 = iVar22 + 1;
    bVar13 = iVar22 < 1;
    iVar28 = iVar28 + iVar26;
    iVar22 = iVar1;
  } while (iVar1 != 2);
LAB_0186c5be:
  iVar22 = iVar17 * iVar10 + iVar23 + -1;
  bVar14 = true;
  iVar26 = -1;
  do {
    lVar20 = 0;
    do {
      if (((*(uint *)((long)pvVar30 + (long)(iVar22 + (int)lVar20) * 4) & 0xffffff) == 0) !=
          ((RVar9.m_value & 0xffffff) != 0)) goto LAB_0186c612;
      lVar20 = lVar20 + 1;
    } while (lVar20 != 3);
    iVar28 = iVar26 + 1;
    bVar14 = iVar26 < 1;
    iVar22 = iVar22 + iVar10;
    iVar26 = iVar28;
  } while (iVar28 != 2);
LAB_0186c612:
  if ((bool)(bVar13 & bVar14)) {
    if ((RVar9.m_value & 0xffffff) == 0) {
      res.m_data[0] = 0;
    }
    else {
      res.m_data[0] =
           ((RVar9.m_value >> 8 & 0xff) + (RVar9.m_value >> 0x10 & 0xff) + (RVar9.m_value & 0xff) >>
           3) + 0x32;
    }
    res.m_data[1] = 0xff;
    res.m_data[3] = 0xff;
    res.m_data[2] = res.m_data[0];
    tcu::PixelBufferAccess::setPixel(&errorAccess,&res,iVar23,iVar19,0);
  }
  else {
    tcu::PixelBufferAccess::setPixel(&errorAccess,&local_428,iVar23,iVar19,0);
    iVar18 = iVar18 + 1;
  }
LAB_0186c6d7:
  iVar23 = iVar23 + 1;
  if (iVar23 == iVar27) goto LAB_0186c6f0;
  goto LAB_0186c2ff;
}

Assistant:

bool DrawTest::compare (gls::DrawTestSpec::Primitive primitiveType)
{
	const tcu::Surface&	ref		= m_rrArrayPack->getSurface();
	const tcu::Surface&	screen	= m_glArrayPack->getSurface();

	if (m_renderCtx.getRenderTarget().getNumSamples() > 1)
	{
		// \todo [mika] Improve compare when using multisampling
		m_testCtx.getLog() << tcu::TestLog::Message << "Warning: Comparision of result from multisample render targets are not as stricts as without multisampling. Might produce false positives!" << tcu::TestLog::EndMessage;
		return tcu::fuzzyCompare(m_testCtx.getLog(), "Compare Results", "Compare Results", ref.getAccess(), screen.getAccess(), 0.3f, tcu::COMPARE_LOG_RESULT);
	}
	else
	{
		const PrimitiveClass	primitiveClass							= getDrawPrimitiveClass(primitiveType);
		const int				maxAllowedInvalidPixelsWithPoints		= 0;	//!< points are unlikely to have overlapping fragments
		const int				maxAllowedInvalidPixelsWithLines		= 5;	//!< line are allowed to have a few bad pixels
		const int				maxAllowedInvalidPixelsWithTriangles	= 10;

		switch (primitiveClass)
		{
			case PRIMITIVECLASS_POINT:
			{
				// Point are extremely unlikely to have overlapping regions, don't allow any no extra / missing pixels
				return tcu::intThresholdPositionDeviationErrorThresholdCompare(m_testCtx.getLog(),
																			   "CompareResult",
																			   "Result of rendering",
																			   ref.getAccess(),
																			   screen.getAccess(),
																			   tcu::UVec4(m_maxDiffRed, m_maxDiffGreen, m_maxDiffBlue, 256),
																			   tcu::IVec3(1, 1, 0),					//!< 3x3 search kernel
																			   true,								//!< relax comparison on the image boundary
																			   maxAllowedInvalidPixelsWithPoints,	//!< error threshold
																			   tcu::COMPARE_LOG_RESULT);
			}

			case PRIMITIVECLASS_LINE:
			{
				// Lines can potentially have a large number of overlapping pixels. Pixel comparison may potentially produce
				// false negatives in such pixels if for example the pixel in question is overdrawn by another line in the
				// reference image but not in the resultin image. Relax comparison near line intersection points (areas) and
				// compare only coverage, not color, in such pixels
				return intersectionRelaxedLineImageCompare(m_testCtx.getLog(),
														   "CompareResult",
														   "Result of rendering",
														   ref,
														   screen,
														   tcu::IVec3(m_maxDiffRed, m_maxDiffGreen, m_maxDiffBlue),
														   maxAllowedInvalidPixelsWithLines);
			}

			case PRIMITIVECLASS_TRIANGLE:
			{
				// Triangles are likely to partially or fully overlap. Pixel difference comparison is fragile in pixels
				// where there could be potential overlapping since the  pixels might be covered by one triangle in the
				// reference image and by the other in the result image. Relax comparsion near primitive edges and
				// compare only coverage, not color, in such pixels.
				const tcu::IVec3	renderTargetThreshold					= m_renderCtx.getRenderTarget().getPixelFormat().getColorThreshold().toIVec().xyz();

				return edgeRelaxedImageCompare(m_testCtx.getLog(),
											   "CompareResult",
											   "Result of rendering",
											   ref,
											   screen,
											   tcu::IVec3(m_maxDiffRed, m_maxDiffGreen, m_maxDiffBlue),
											   renderTargetThreshold,
											   maxAllowedInvalidPixelsWithTriangles);
			}

			default:
				DE_ASSERT(false);
				return false;
		}
	}
}